

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::basic_value<toml::type_config>_*,_toml::error_info> *
toml::detail::insert_value<toml::type_config>
          (inserting_value_kind kind,table_type *current_table_ptr,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys,region *key_reg,basic_value<toml::type_config> *val)

{
  initializer_list<toml::basic_value<toml::type_config>_> __l;
  array_format_info fmt_00;
  table_format_info fmt_01;
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  array_format_info *paVar4;
  pointer ppVar5;
  table_format_info *ptVar6;
  basic_value<toml::type_config> *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  table_type *in_RDX;
  char in_SIL;
  result<toml::basic_value<toml::type_config>_*,_toml::error_info> *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>,_bool>
  pVar7;
  array_format_info fmt_2;
  iterator found_2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>
  *kv;
  iterator __end0;
  iterator __begin0;
  table_type *__range7;
  basic_value<toml::type_config> *target;
  iterator found_1;
  value_type *current_array_table;
  table_format fmt_1;
  table_format_info fmt;
  iterator found;
  table_type *current_table;
  value_type *key;
  size_t i;
  source_location key_loc;
  basic_value<toml::type_config> *in_stack_ffffffffffffe178;
  failure_type *f;
  char *in_stack_ffffffffffffe180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe188;
  basic_value<toml::type_config> *in_stack_ffffffffffffe190;
  basic_value<toml::type_config> *in_stack_ffffffffffffe198;
  source_location *in_stack_ffffffffffffe1a0;
  basic_value<toml::type_config> *in_stack_ffffffffffffe1a8;
  basic_value<toml::type_config> *in_stack_ffffffffffffe1b0;
  iterator in_stack_ffffffffffffe1b8;
  basic_value<toml::type_config> *in_stack_ffffffffffffe1c0;
  error_info *in_stack_ffffffffffffe1d8;
  error_info *v;
  basic_value<toml::type_config> *in_stack_ffffffffffffe1e0;
  region_type *in_stack_ffffffffffffe1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffe1f0;
  region *in_stack_ffffffffffffe1f8;
  basic_value<toml::type_config> *in_stack_ffffffffffffe200;
  region_type *in_stack_ffffffffffffe208;
  basic_value<toml::type_config> *in_stack_ffffffffffffe210;
  table_type *in_stack_ffffffffffffe218;
  int32_t in_stack_ffffffffffffe220;
  undefined4 in_stack_ffffffffffffe224;
  undefined8 in_stack_ffffffffffffe228;
  undefined8 in_stack_ffffffffffffe230;
  undefined8 **local_1db0;
  string *in_stack_ffffffffffffe338;
  source_location *in_stack_ffffffffffffe340;
  undefined7 in_stack_ffffffffffffe348;
  undefined1 in_stack_ffffffffffffe34f;
  table_type *in_stack_ffffffffffffe3e8;
  source_location *in_stack_ffffffffffffe3f0;
  string *in_stack_ffffffffffffe3f8;
  string *msg;
  source_location *in_stack_ffffffffffffe400;
  source_location *loc;
  string *in_stack_ffffffffffffe408;
  source_location *in_stack_ffffffffffffe420;
  table_type *in_stack_ffffffffffffe428;
  allocator<char> local_1b51 [160];
  allocator<char> local_1ab1 [209];
  reference local_19e0;
  value_type local_19d8;
  allocator<char> local_1951 [160];
  error_info local_18b1 [3];
  allocator<char> local_1761 [160];
  allocator<char> local_16c1 [209];
  reference local_15f0;
  value_type local_15e8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_15e0;
  undefined1 local_15d8;
  undefined8 local_15d0;
  int32_t local_15c8;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1548;
  undefined8 local_1538;
  int32_t local_1530;
  allocator<toml::basic_value<toml::type_config>_> local_1529;
  undefined1 **local_1528;
  undefined8 *local_1520 [25];
  undefined1 **local_1458;
  undefined8 local_1450;
  array_format_info local_1364;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_1358;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_1350;
  mapped_type *local_1348;
  value_type local_1340;
  failure_type local_1338 [2];
  allocator<char> local_1241 [160];
  allocator<char> local_11a1 [209];
  reference local_10d0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_10c8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_10c0;
  table_type *local_10b8;
  allocator<char> local_1031 [160];
  allocator<char> local_f91 [209];
  basic_value<toml::type_config> *local_ec0;
  mapped_type *local_eb8;
  value_type local_eb0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_ea8;
  undefined1 local_ea0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_e98;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_e90;
  mapped_type *local_e88;
  value_type local_e80;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_e78;
  undefined1 local_e70;
  allocator<char> local_de9 [160];
  allocator<char> local_d49 [209];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_c78;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_c70 [16];
  allocator<char> local_be9 [160];
  allocator<char> local_b49 [209];
  reference local_a78;
  allocator<char> local_9f1 [160];
  allocator<char> local_951 [336];
  allocator<char> local_801 [160];
  allocator<char> local_761 [336];
  string local_611 [5];
  source_location local_571;
  undefined4 local_49c;
  allocator<char> local_419 [160];
  allocator<char> local_379 [216];
  table_format local_2a1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_2a0;
  undefined1 local_298;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 local_208;
  int32_t iStack_200;
  int32_t iStack_1fc;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  table_format_info local_f0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_e0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_d8;
  table_type *local_d0;
  const_reference local_b8;
  ulong local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  table_type *local_18;
  char local_9;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_9 = in_SIL;
  source_location::source_location
            ((source_location *)in_stack_ffffffffffffe200,in_stack_ffffffffffffe1f8);
  for (local_b0 = 0; uVar3 = local_b0,
      sVar2 = CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_20), uVar3 < sVar2; local_b0 = local_b0 + 1) {
    local_b8 = CLI::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffe180,(size_type)in_stack_ffffffffffffe178);
    local_d0 = local_18;
    uVar3 = local_b0 + 1;
    sVar2 = CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_20);
    if (uVar3 < sVar2) {
      local_d8._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
           ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                   *)in_stack_ffffffffffffe178,(key_type *)0x725e96);
      local_e0._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                  *)in_stack_ffffffffffffe178);
      bVar1 = std::__detail::operator==(&local_d8,&local_e0);
      if (bVar1) {
        table_format_info::table_format_info(&local_f0);
        local_f0.indent_type = none;
        if (local_9 == '\x02') {
          local_f0.fmt = dotted;
        }
        else {
          local_f0.fmt = implicit;
        }
        local_1d8 = 0;
        uStack_1d0 = 0;
        local_1e8 = 0;
        uStack_1e0 = 0;
        local_1f8 = 0;
        uStack_1f0 = 0;
        local_1c8 = 0;
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
        ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                         *)0x725f89);
        local_208 = CONCAT62(local_f0._2_6_,CONCAT11(local_f0.indent_type,local_f0.fmt));
        iStack_200 = local_f0.name_indent;
        iStack_1fc = local_f0.closing_indent;
        local_228 = 0;
        uStack_220 = 0;
        local_218 = 0;
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x725fc2);
        region::region((region *)in_stack_ffffffffffffe1a0,(region *)in_stack_ffffffffffffe198);
        fmt_01.name_indent = (int)in_stack_ffffffffffffe230;
        fmt_01.closing_indent = (int)((ulong)in_stack_ffffffffffffe230 >> 0x20);
        fmt_01.fmt = (char)in_stack_ffffffffffffe228;
        fmt_01.indent_type = (char)((ulong)in_stack_ffffffffffffe228 >> 8);
        fmt_01._2_2_ = (short)((ulong)in_stack_ffffffffffffe228 >> 0x10);
        fmt_01.body_indent = (int)((ulong)in_stack_ffffffffffffe228 >> 0x20);
        basic_value<toml::type_config>::basic_value
                  ((basic_value<toml::type_config> *)
                   CONCAT44(in_stack_ffffffffffffe224,in_stack_ffffffffffffe220),
                   in_stack_ffffffffffffe218,fmt_01,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffe210,in_stack_ffffffffffffe208);
        pVar7 = std::
                unordered_map<std::__cxx11::string,toml::basic_value<toml::type_config>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>>
                ::emplace<std::__cxx11::string_const&,toml::basic_value<toml::type_config>>
                          ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                            *)in_stack_ffffffffffffe190,in_stack_ffffffffffffe188,
                           (basic_value<toml::type_config> *)in_stack_ffffffffffffe180);
        local_2a0._M_cur =
             (__node_type *)
             pVar7.first.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
             ._M_cur;
        local_298 = pVar7.second;
        basic_value<toml::type_config>::~basic_value
                  ((basic_value<toml::type_config> *)in_stack_ffffffffffffe180);
        region::~region((region *)in_stack_ffffffffffffe180);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffe190);
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
        ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                          *)0x726090);
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
        ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
              *)in_stack_ffffffffffffe180,(key_type *)in_stack_ffffffffffffe178);
        in_stack_ffffffffffffe428 =
             basic_value<toml::type_config>::as_table_abi_cxx11_(in_stack_ffffffffffffe1c0);
        local_18 = in_stack_ffffffffffffe428;
      }
      else {
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
        ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                      *)0x726161);
        bVar1 = basic_value<toml::type_config>::is_table((basic_value<toml::type_config> *)0x72616d)
        ;
        if (bVar1) {
          std::__detail::
          _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
          ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                        *)0x726183);
          in_stack_ffffffffffffe420 =
               (source_location *)
               basic_value<toml::type_config>::as_table_fmt(in_stack_ffffffffffffe1c0);
          local_2a1 = in_stack_ffffffffffffe420->is_ok_;
          if (((bool)local_2a1 == true) || (local_2a1 == multiline_oneline)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe1c0,(char *)in_stack_ffffffffffffe1b8,
                       (allocator<char> *)in_stack_ffffffffffffe1b0);
            source_location::source_location
                      (in_stack_ffffffffffffe1a0,(source_location *)in_stack_ffffffffffffe198);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe1c0,(char *)in_stack_ffffffffffffe1b8,
                       (allocator<char> *)in_stack_ffffffffffffe1b0);
            std::__detail::
            _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
            ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                          *)0x72624c);
            basic_value<toml::type_config>::location(in_stack_ffffffffffffe178);
            make_error_info<toml::source_location,char_const(&)[14]>
                      (in_stack_ffffffffffffe408,in_stack_ffffffffffffe400,in_stack_ffffffffffffe3f8
                       ,in_stack_ffffffffffffe3f0,(char (*) [14])in_stack_ffffffffffffe3e8);
            err<toml::error_info>(in_stack_ffffffffffffe1d8);
            result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
                      ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)
                       in_stack_ffffffffffffe180,(failure_type *)in_stack_ffffffffffffe178);
            failure<toml::error_info>::~failure((failure<toml::error_info> *)0x7262d9);
            error_info::~error_info((error_info *)in_stack_ffffffffffffe180);
            source_location::~source_location((source_location *)in_stack_ffffffffffffe180);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe180);
            std::allocator<char>::~allocator(local_419);
            source_location::~source_location((source_location *)in_stack_ffffffffffffe180);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe180);
            std::allocator<char>::~allocator(local_379);
            goto LAB_00728843;
          }
          if ((local_9 == '\x02') && (local_2a1 != dotted)) {
            loc = &local_571;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe1c0,(char *)in_stack_ffffffffffffe1b8,
                       (allocator<char> *)in_stack_ffffffffffffe1b0);
            source_location::source_location
                      (in_stack_ffffffffffffe1a0,(source_location *)in_stack_ffffffffffffe198);
            msg = local_611;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe1c0,(char *)in_stack_ffffffffffffe1b8,
                       (allocator<char> *)in_stack_ffffffffffffe1b0);
            std::__detail::
            _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
            ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                          *)0x7264df);
            basic_value<toml::type_config>::location(in_stack_ffffffffffffe178);
            make_error_info<toml::source_location,char_const(&)[29]>
                      (in_stack_ffffffffffffe408,loc,msg,in_stack_ffffffffffffe3f0,
                       (char (*) [29])in_stack_ffffffffffffe3e8);
            err<toml::error_info>(in_stack_ffffffffffffe1d8);
            result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
                      ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)
                       in_stack_ffffffffffffe180,(failure_type *)in_stack_ffffffffffffe178);
            failure<toml::error_info>::~failure((failure<toml::error_info> *)0x72656c);
            error_info::~error_info((error_info *)in_stack_ffffffffffffe180);
            source_location::~source_location((source_location *)in_stack_ffffffffffffe180);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe180);
            std::allocator<char>::~allocator((allocator<char> *)local_611);
            source_location::~source_location((source_location *)in_stack_ffffffffffffe180);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe180);
            std::allocator<char>::~allocator((allocator<char> *)&local_571);
            goto LAB_00728843;
          }
          std::__detail::
          _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
          ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                        *)0x7266d9);
          in_stack_ffffffffffffe3e8 =
               basic_value<toml::type_config>::as_table_abi_cxx11_(in_stack_ffffffffffffe1c0);
          local_18 = in_stack_ffffffffffffe3e8;
        }
        else {
          std::__detail::
          _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
          ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                        *)0x726711);
          bVar1 = basic_value<toml::type_config>::is_array_of_tables(in_stack_ffffffffffffe1a8);
          if (!bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe1c0,(char *)in_stack_ffffffffffffe1b8,
                       (allocator<char> *)in_stack_ffffffffffffe1b0);
            source_location::source_location
                      (in_stack_ffffffffffffe1a0,(source_location *)in_stack_ffffffffffffe198);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe1c0,(char *)in_stack_ffffffffffffe1b8,
                       (allocator<char> *)in_stack_ffffffffffffe1b0);
            std::__detail::
            _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
            ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                          *)0x726d44);
            basic_value<toml::type_config>::location(in_stack_ffffffffffffe178);
            make_error_info<toml::source_location,char_const(&)[31]>
                      (in_stack_ffffffffffffe408,in_stack_ffffffffffffe400,in_stack_ffffffffffffe3f8
                       ,in_stack_ffffffffffffe3f0,(char (*) [31])in_stack_ffffffffffffe3e8);
            err<toml::error_info>(in_stack_ffffffffffffe1d8);
            result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
                      ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)
                       in_stack_ffffffffffffe180,(failure_type *)in_stack_ffffffffffffe178);
            failure<toml::error_info>::~failure((failure<toml::error_info> *)0x726dd1);
            error_info::~error_info((error_info *)in_stack_ffffffffffffe180);
            source_location::~source_location((source_location *)in_stack_ffffffffffffe180);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe180);
            std::allocator<char>::~allocator(local_be9);
            source_location::~source_location((source_location *)in_stack_ffffffffffffe180);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe180);
            std::allocator<char>::~allocator(local_b49);
            goto LAB_00728843;
          }
          std::__detail::
          _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
          ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                        *)0x726733);
          paVar4 = basic_value<toml::type_config>::as_array_fmt(in_stack_ffffffffffffe1c0);
          if (paVar4->fmt != array_of_tables) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe1c0,(char *)in_stack_ffffffffffffe1b8,
                       (allocator<char> *)in_stack_ffffffffffffe1b0);
            source_location::source_location
                      (in_stack_ffffffffffffe1a0,(source_location *)in_stack_ffffffffffffe198);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe1c0,(char *)in_stack_ffffffffffffe1b8,
                       (allocator<char> *)in_stack_ffffffffffffe1b0);
            std::__detail::
            _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
            ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                          *)0x7267e4);
            basic_value<toml::type_config>::location(in_stack_ffffffffffffe178);
            make_error_info<toml::source_location,char_const(&)[23]>
                      (in_stack_ffffffffffffe408,in_stack_ffffffffffffe400,in_stack_ffffffffffffe3f8
                       ,in_stack_ffffffffffffe3f0,(char (*) [23])in_stack_ffffffffffffe3e8);
            err<toml::error_info>(in_stack_ffffffffffffe1d8);
            result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
                      ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)
                       in_stack_ffffffffffffe180,(failure_type *)in_stack_ffffffffffffe178);
            failure<toml::error_info>::~failure((failure<toml::error_info> *)0x726871);
            error_info::~error_info((error_info *)in_stack_ffffffffffffe180);
            source_location::~source_location((source_location *)in_stack_ffffffffffffe180);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe180);
            std::allocator<char>::~allocator(local_801);
            source_location::~source_location((source_location *)in_stack_ffffffffffffe180);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe180);
            std::allocator<char>::~allocator(local_761);
            goto LAB_00728843;
          }
          if (local_9 == '\x02') {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe1c0,(char *)in_stack_ffffffffffffe1b8,
                       (allocator<char> *)in_stack_ffffffffffffe1b0);
            source_location::source_location
                      (in_stack_ffffffffffffe1a0,(source_location *)in_stack_ffffffffffffe198);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe1c0,(char *)in_stack_ffffffffffffe1b8,
                       (allocator<char> *)in_stack_ffffffffffffe1b0);
            std::__detail::
            _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
            ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                          *)0x726a69);
            basic_value<toml::type_config>::location(in_stack_ffffffffffffe178);
            make_error_info<toml::source_location,char_const(&)[25]>
                      (in_stack_ffffffffffffe408,in_stack_ffffffffffffe400,in_stack_ffffffffffffe3f8
                       ,in_stack_ffffffffffffe3f0,(char (*) [25])in_stack_ffffffffffffe3e8);
            err<toml::error_info>(in_stack_ffffffffffffe1d8);
            result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
                      ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)
                       in_stack_ffffffffffffe180,(failure_type *)in_stack_ffffffffffffe178);
            failure<toml::error_info>::~failure((failure<toml::error_info> *)0x726af6);
            error_info::~error_info((error_info *)in_stack_ffffffffffffe180);
            source_location::~source_location((source_location *)in_stack_ffffffffffffe180);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe180);
            std::allocator<char>::~allocator(local_9f1);
            source_location::~source_location((source_location *)in_stack_ffffffffffffe180);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe180);
            std::allocator<char>::~allocator(local_951);
            goto LAB_00728843;
          }
          std::__detail::
          _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
          ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                        *)0x726c63);
          basic_value<toml::type_config>::as_array(in_stack_ffffffffffffe1c0);
          local_a78 = std::
                      vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                      ::back((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                              *)in_stack_ffffffffffffe180);
          local_18 = basic_value<toml::type_config>::as_table_abi_cxx11_(in_stack_ffffffffffffe1c0);
        }
      }
    }
    else {
      if (local_9 == '\0') {
        local_e90._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                     *)in_stack_ffffffffffffe178,(key_type *)0x727340);
        local_e98._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                    *)in_stack_ffffffffffffe178);
        bVar1 = std::__detail::operator==(&local_e90,&local_e98);
        if (bVar1) {
          pVar7 = std::
                  unordered_map<std::__cxx11::string,toml::basic_value<toml::type_config>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>>
                  ::emplace<std::__cxx11::string_const&,toml::basic_value<toml::type_config>>
                            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                              *)in_stack_ffffffffffffe190,in_stack_ffffffffffffe188,
                             (basic_value<toml::type_config> *)in_stack_ffffffffffffe180);
          local_ea8._M_cur =
               (__node_type *)
               pVar7.first.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
               ._M_cur;
          local_ea0 = pVar7.second;
          local_eb8 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                      ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                            *)in_stack_ffffffffffffe180,(key_type *)in_stack_ffffffffffffe178);
          local_eb0 = (value_type)
                      ok<toml::basic_value<toml::type_config>*>
                                ((basic_value<toml::type_config> **)in_stack_ffffffffffffe178);
          result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
                    (in_RDI,(success_type)local_eb0);
          goto LAB_00728843;
        }
        ppVar5 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                               *)0x727463);
        local_ec0 = &ppVar5->second;
        bVar1 = basic_value<toml::type_config>::is_table((basic_value<toml::type_config> *)0x72747c)
        ;
        if ((!bVar1) ||
           (ptVar6 = basic_value<toml::type_config>::as_table_fmt(in_stack_ffffffffffffe1c0),
           ptVar6->fmt != implicit)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe1c0,(char *)in_stack_ffffffffffffe1b8,
                     (allocator<char> *)in_stack_ffffffffffffe1b0);
          source_location::source_location
                    (in_stack_ffffffffffffe1a0,(source_location *)in_stack_ffffffffffffe198);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe1c0,(char *)in_stack_ffffffffffffe1b8,
                     (allocator<char> *)in_stack_ffffffffffffe1b0);
          basic_value<toml::type_config>::location(in_stack_ffffffffffffe178);
          make_error_info<toml::source_location,char_const(&)[33]>
                    (in_stack_ffffffffffffe408,in_stack_ffffffffffffe400,in_stack_ffffffffffffe3f8,
                     in_stack_ffffffffffffe3f0,(char (*) [33])in_stack_ffffffffffffe3e8);
          err<toml::error_info>(in_stack_ffffffffffffe1d8);
          result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
                    ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)
                     in_stack_ffffffffffffe180,(failure_type *)in_stack_ffffffffffffe178);
          failure<toml::error_info>::~failure((failure<toml::error_info> *)0x7275b5);
          error_info::~error_info((error_info *)in_stack_ffffffffffffe180);
          source_location::~source_location((source_location *)in_stack_ffffffffffffe180);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe180);
          std::allocator<char>::~allocator(local_1031);
          source_location::~source_location((source_location *)in_stack_ffffffffffffe180);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe180);
          std::allocator<char>::~allocator(local_f91);
          goto LAB_00728843;
        }
        local_10b8 = basic_value<toml::type_config>::as_table_abi_cxx11_(in_stack_ffffffffffffe1c0);
        local_10c0._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
             ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                      *)in_stack_ffffffffffffe178);
        local_10c8._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                    *)in_stack_ffffffffffffe178);
        goto LAB_00727766;
      }
      if (local_9 == '\x01') {
        local_1350._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                     *)in_stack_ffffffffffffe178,(key_type *)0x727be0);
        local_1358._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                    *)in_stack_ffffffffffffe178);
        bVar1 = std::__detail::operator==(&local_1350,&local_1358);
        if (bVar1) {
          array_format_info::array_format_info(&local_1364);
          local_1364.fmt = array_of_tables;
          local_1364.indent_type = none;
          local_1528 = (undefined1 **)local_1520;
          basic_value<toml::type_config>::basic_value
                    (in_stack_ffffffffffffe1b0,in_stack_ffffffffffffe1a8);
          local_1458 = (undefined1 **)local_1520;
          local_1450 = 1;
          std::allocator<toml::basic_value<toml::type_config>_>::allocator
                    ((allocator<toml::basic_value<toml::type_config>_> *)0x727cba);
          __l._M_len = (size_type)in_stack_ffffffffffffe1c0;
          __l._M_array = in_stack_ffffffffffffe1b8;
          std::
          vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
          ::vector((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                    *)in_stack_ffffffffffffe1b0,__l,(allocator_type *)in_stack_ffffffffffffe1a8);
          local_1530 = local_1364.closing_indent;
          local_1538 = CONCAT62(local_1364._2_6_,CONCAT11(local_1364.indent_type,local_1364.fmt));
          local_1558 = 0;
          uStack_1550 = 0;
          local_1548 = 0;
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x727d2b);
          region::region((region *)in_stack_ffffffffffffe180,(region *)in_stack_ffffffffffffe178);
          local_15c8 = local_1530;
          local_15d0 = local_1538;
          fmt_00.closing_indent = in_stack_ffffffffffffe220;
          fmt_00._0_8_ = in_stack_ffffffffffffe218;
          basic_value<toml::type_config>::basic_value
                    (in_stack_ffffffffffffe200,(array_type *)in_stack_ffffffffffffe1f8,fmt_00,
                     in_stack_ffffffffffffe1f0,in_stack_ffffffffffffe1e8);
          pVar7 = std::
                  unordered_map<std::__cxx11::string,toml::basic_value<toml::type_config>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>>
                  ::emplace<std::__cxx11::string_const&,toml::basic_value<toml::type_config>>
                            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                              *)in_stack_ffffffffffffe190,in_stack_ffffffffffffe188,
                             (basic_value<toml::type_config> *)in_stack_ffffffffffffe180);
          local_15e0._M_cur =
               (__node_type *)
               pVar7.first.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
               ._M_cur;
          local_15d8 = pVar7.second;
          basic_value<toml::type_config>::~basic_value
                    ((basic_value<toml::type_config> *)in_stack_ffffffffffffe180);
          region::~region((region *)in_stack_ffffffffffffe180);
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffe190);
          std::
          vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
          ::~vector((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                     *)in_stack_ffffffffffffe190);
          std::allocator<toml::basic_value<toml::type_config>_>::~allocator(&local_1529);
          local_1db0 = &local_1458;
          do {
            local_1db0 = local_1db0 + -0x19;
            basic_value<toml::type_config>::~basic_value
                      ((basic_value<toml::type_config> *)in_stack_ffffffffffffe180);
          } while (local_1db0 != local_1520);
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
          ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                *)in_stack_ffffffffffffe180,(key_type *)in_stack_ffffffffffffe178);
          basic_value<toml::type_config>::as_array(in_stack_ffffffffffffe1c0);
          local_15f0 = std::
                       vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                       ::back((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                               *)in_stack_ffffffffffffe180);
          local_15e8 = (value_type)
                       ok<toml::basic_value<toml::type_config>*>
                                 ((basic_value<toml::type_config> **)in_stack_ffffffffffffe178);
          result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
                    (in_RDI,(success_type)local_15e8);
        }
        else {
          std::__detail::
          _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
          ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                        *)0x728072);
          bVar1 = basic_value<toml::type_config>::is_array_of_tables(in_stack_ffffffffffffe1a8);
          if (bVar1) {
            std::__detail::
            _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
            ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                          *)0x7282fe);
            paVar4 = basic_value<toml::type_config>::as_array_fmt(in_stack_ffffffffffffe1c0);
            if (paVar4->fmt == array_of_tables) {
              std::__detail::
              _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
              ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                            *)0x728591);
              this = (basic_value<toml::type_config> *)
                     basic_value<toml::type_config>::as_array(in_stack_ffffffffffffe1c0);
              std::
              vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
              ::push_back((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                           *)in_stack_ffffffffffffe180,in_stack_ffffffffffffe178);
              std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
              ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                    *)in_stack_ffffffffffffe180,(key_type *)in_stack_ffffffffffffe178);
              basic_value<toml::type_config>::as_array(this);
              local_19e0 = std::
                           vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                           ::back((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                                   *)in_stack_ffffffffffffe180);
              local_19d8 = (value_type)
                           ok<toml::basic_value<toml::type_config>*>
                                     ((basic_value<toml::type_config> **)in_stack_ffffffffffffe178);
              result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
                        (in_RDI,(success_type)local_19d8);
            }
            else {
              v = local_18b1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffe1c0,(char *)in_stack_ffffffffffffe1b8,
                         (allocator<char> *)in_stack_ffffffffffffe1b0);
              source_location::source_location
                        (in_stack_ffffffffffffe1a0,(source_location *)in_stack_ffffffffffffe198);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffe1c0,(char *)in_stack_ffffffffffffe1b8,
                         (allocator<char> *)in_stack_ffffffffffffe1b0);
              std::__detail::
              _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
              ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                            *)0x72839d);
              basic_value<toml::type_config>::location(in_stack_ffffffffffffe178);
              make_error_info<toml::source_location,char_const(&)[31]>
                        (in_stack_ffffffffffffe408,in_stack_ffffffffffffe400,
                         in_stack_ffffffffffffe3f8,in_stack_ffffffffffffe3f0,
                         (char (*) [31])in_stack_ffffffffffffe3e8);
              err<toml::error_info>(v);
              result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
                        ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)
                         in_stack_ffffffffffffe180,(failure_type *)in_stack_ffffffffffffe178);
              failure<toml::error_info>::~failure((failure<toml::error_info> *)0x728424);
              error_info::~error_info((error_info *)in_stack_ffffffffffffe180);
              source_location::~source_location((source_location *)in_stack_ffffffffffffe180);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffe180);
              std::allocator<char>::~allocator(local_1951);
              source_location::~source_location((source_location *)in_stack_ffffffffffffe180);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffe180);
              std::allocator<char>::~allocator((allocator<char> *)local_18b1);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe1c0,(char *)in_stack_ffffffffffffe1b8,
                       (allocator<char> *)in_stack_ffffffffffffe1b0);
            source_location::source_location
                      (in_stack_ffffffffffffe1a0,(source_location *)in_stack_ffffffffffffe198);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe1c0,(char *)in_stack_ffffffffffffe1b8,
                       (allocator<char> *)in_stack_ffffffffffffe1b0);
            std::__detail::
            _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
            ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                          *)0x72810a);
            basic_value<toml::type_config>::location(in_stack_ffffffffffffe178);
            make_error_info<toml::source_location,char_const(&)[31]>
                      (in_stack_ffffffffffffe408,in_stack_ffffffffffffe400,in_stack_ffffffffffffe3f8
                       ,in_stack_ffffffffffffe3f0,(char (*) [31])in_stack_ffffffffffffe3e8);
            err<toml::error_info>(in_stack_ffffffffffffe1d8);
            result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
                      ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)
                       in_stack_ffffffffffffe180,(failure_type *)in_stack_ffffffffffffe178);
            failure<toml::error_info>::~failure((failure<toml::error_info> *)0x728191);
            error_info::~error_info((error_info *)in_stack_ffffffffffffe180);
            source_location::~source_location((source_location *)in_stack_ffffffffffffe180);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe180);
            std::allocator<char>::~allocator(local_1761);
            source_location::~source_location((source_location *)in_stack_ffffffffffffe180);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe180);
            std::allocator<char>::~allocator(local_16c1);
          }
        }
        goto LAB_00728843;
      }
      if (local_9 == '\x02') {
        local_c70[0]._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                     *)in_stack_ffffffffffffe178,(key_type *)0x726f89);
        local_c78._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                    *)in_stack_ffffffffffffe178);
        bVar1 = std::__detail::operator==(local_c70,&local_c78);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          pVar7 = std::
                  unordered_map<std::__cxx11::string,toml::basic_value<toml::type_config>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>>
                  ::emplace<std::__cxx11::string_const&,toml::basic_value<toml::type_config>>
                            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                              *)in_stack_ffffffffffffe190,in_stack_ffffffffffffe188,
                             (basic_value<toml::type_config> *)in_stack_ffffffffffffe180);
          local_e78._M_cur =
               (__node_type *)
               pVar7.first.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
               ._M_cur;
          local_e70 = pVar7.second;
          local_e88 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                      ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                            *)in_stack_ffffffffffffe180,(key_type *)in_stack_ffffffffffffe178);
          local_e80 = (value_type)
                      ok<toml::basic_value<toml::type_config>*>
                                ((basic_value<toml::type_config> **)in_stack_ffffffffffffe178);
          result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
                    (in_RDI,(success_type)local_e80);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe1c0,(char *)in_stack_ffffffffffffe1b8,
                     (allocator<char> *)in_stack_ffffffffffffe1b0);
          source_location::source_location
                    (in_stack_ffffffffffffe1a0,(source_location *)in_stack_ffffffffffffe198);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe1c0,(char *)in_stack_ffffffffffffe1b8,
                     (allocator<char> *)in_stack_ffffffffffffe1b0);
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
          ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                *)in_stack_ffffffffffffe180,(key_type *)in_stack_ffffffffffffe178);
          basic_value<toml::type_config>::location(in_stack_ffffffffffffe178);
          make_error_info<toml::source_location,char_const(&)[25]>
                    (in_stack_ffffffffffffe408,in_stack_ffffffffffffe400,in_stack_ffffffffffffe3f8,
                     in_stack_ffffffffffffe3f0,(char (*) [25])in_stack_ffffffffffffe3e8);
          err<toml::error_info>(in_stack_ffffffffffffe1d8);
          result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
                    ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)
                     in_stack_ffffffffffffe180,(failure_type *)in_stack_ffffffffffffe178);
          failure<toml::error_info>::~failure((failure<toml::error_info> *)0x727102);
          error_info::~error_info((error_info *)in_stack_ffffffffffffe180);
          source_location::~source_location((source_location *)in_stack_ffffffffffffe180);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe180);
          std::allocator<char>::~allocator(local_de9);
          source_location::~source_location((source_location *)in_stack_ffffffffffffe180);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe180);
          std::allocator<char>::~allocator(local_d49);
        }
        goto LAB_00728843;
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe1c0,(char *)in_stack_ffffffffffffe1b8,
             (allocator<char> *)in_stack_ffffffffffffe1b0);
  source_location::source_location
            ((source_location *)in_stack_ffffffffffffe180,
             (source_location *)in_stack_ffffffffffffe178);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe1c0,(char *)in_stack_ffffffffffffe1b8,
             (allocator<char> *)in_stack_ffffffffffffe1b0);
  make_error_info<>((string *)CONCAT17(in_stack_ffffffffffffe34f,in_stack_ffffffffffffe348),
                    in_stack_ffffffffffffe340,in_stack_ffffffffffffe338);
  err<toml::error_info>(in_stack_ffffffffffffe1d8);
  result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
            ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)
             in_stack_ffffffffffffe180,(failure_type *)in_stack_ffffffffffffe178);
  failure<toml::error_info>::~failure((failure<toml::error_info> *)0x72872f);
  error_info::~error_info((error_info *)in_stack_ffffffffffffe180);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe180);
  std::allocator<char>::~allocator(local_1b51);
  source_location::~source_location((source_location *)in_stack_ffffffffffffe180);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe180);
  std::allocator<char>::~allocator(local_1ab1);
LAB_00728843:
  local_49c = 1;
  source_location::~source_location((source_location *)in_stack_ffffffffffffe180);
  return in_RDI;
LAB_00727766:
  bVar1 = std::__detail::operator==(&local_10c0,&local_10c8);
  if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_00727b15;
  local_10d0 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
               ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                            *)0x727793);
  bVar1 = basic_value<toml::type_config>::contains
                    (in_stack_ffffffffffffe1e0,&in_stack_ffffffffffffe1d8->title_);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe1c0,(char *)in_stack_ffffffffffffe1b8,
               (allocator<char> *)in_stack_ffffffffffffe1b0);
    source_location::source_location
              (in_stack_ffffffffffffe1a0,(source_location *)in_stack_ffffffffffffe198);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe1c0,(char *)in_stack_ffffffffffffe1b8,
               (allocator<char> *)in_stack_ffffffffffffe1b0);
    basic_value<toml::type_config>::location(in_stack_ffffffffffffe178);
    basic_value<toml::type_config>::at
              (in_stack_ffffffffffffe210,(key_type *)in_stack_ffffffffffffe208);
    basic_value<toml::type_config>::location(in_stack_ffffffffffffe178);
    in_stack_ffffffffffffe180 = "already defined here";
    f = local_1338;
    make_error_info<toml::source_location,char_const(&)[18],toml::source_location,char_const(&)[21]>
              (in_stack_ffffffffffffe408,in_stack_ffffffffffffe400,in_stack_ffffffffffffe3f8,
               in_stack_ffffffffffffe3f0,(char (*) [18])in_stack_ffffffffffffe3e8,
               in_stack_ffffffffffffe420,(char (*) [21])in_stack_ffffffffffffe428);
    err<toml::error_info>(in_stack_ffffffffffffe1d8);
    result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
              ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)
               in_stack_ffffffffffffe180,f);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x727927);
    error_info::~error_info((error_info *)in_stack_ffffffffffffe180);
    source_location::~source_location((source_location *)in_stack_ffffffffffffe180);
    source_location::~source_location((source_location *)in_stack_ffffffffffffe180);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe180);
    std::allocator<char>::~allocator(local_1241);
    source_location::~source_location((source_location *)in_stack_ffffffffffffe180);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe180);
    std::allocator<char>::~allocator(local_11a1);
    goto LAB_00728843;
  }
  basic_value<toml::type_config>::operator[]
            (in_stack_ffffffffffffe200,(key_type *)in_stack_ffffffffffffe1f8);
  basic_value<toml::type_config>::operator=(in_stack_ffffffffffffe198,in_stack_ffffffffffffe190);
  std::__detail::
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
  ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                *)in_stack_ffffffffffffe180);
  goto LAB_00727766;
LAB_00727b15:
  ptVar6 = basic_value<toml::type_config>::as_table_fmt(in_stack_ffffffffffffe1c0);
  ptVar6->fmt = multiline;
  change_region_of_value<toml::type_config>
            ((basic_value<toml::type_config> *)in_stack_ffffffffffffe180,in_stack_ffffffffffffe178);
  local_1348 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
               ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                     *)in_stack_ffffffffffffe180,(key_type *)in_stack_ffffffffffffe178);
  local_1340 = (value_type)
               ok<toml::basic_value<toml::type_config>*>
                         ((basic_value<toml::type_config> **)in_stack_ffffffffffffe178);
  result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
            (in_RDI,(success_type)local_1340);
  goto LAB_00728843;
}

Assistant:

result<basic_value<TC>*, error_info>
insert_value(const inserting_value_kind kind,
    typename basic_value<TC>::table_type* current_table_ptr,
    const std::vector<typename basic_value<TC>::key_type>& keys, region key_reg,
    basic_value<TC> val)
{
    using value_type = basic_value<TC>;
    using array_type = typename basic_value<TC>::array_type;
    using table_type = typename basic_value<TC>::table_type;

    auto key_loc = source_location(key_reg);

    assert( ! keys.empty());

    // dotted key can insert to dotted key tables defined at the same level.
    // dotted key can NOT reopen a table even if it is implcitly-defined one.
    //
    // [x.y.z] # define x and x.y implicitly.
    // a = 42
    //
    // [x] # reopening implcitly defined table
    // r.s.t = 3.14 # VALID r and r.s are new tables.
    // r.s.u = 2.71 # VALID r and r.s are dotted-key tables. valid.
    //
    // y.z.b = "foo" # INVALID x.y.z are multiline table, not a dotted key.
    // y.c   = "bar" # INVALID x.y is implicit multiline table, not a dotted key.

    // a table cannot reopen dotted-key tables.
    //
    // [t1]
    // t2.t3.v = 0
    // [t1.t2] # INVALID t1.t2 is defined as a dotted-key table.

    for(std::size_t i=0; i<keys.size(); ++i)
    {
        const auto& key = keys.at(i);
        table_type& current_table = *current_table_ptr;

        if(i+1 < keys.size()) // there are more keys. go down recursively...
        {
            const auto found = current_table.find(key);
            if(found == current_table.end()) // not found. add new table
            {
                table_format_info fmt;
                fmt.indent_type = indent_char::none;
                if(kind == inserting_value_kind::dotted_keys)
                {
                    fmt.fmt = table_format::dotted;
                }
                else // table / array of tables
                {
                    fmt.fmt = table_format::implicit;
                }
                current_table.emplace(key, value_type(
                    table_type{}, fmt, std::vector<std::string>{}, key_reg));

                assert(current_table.at(key).is_table());
                current_table_ptr = std::addressof(current_table.at(key).as_table());
            }
            else if (found->second.is_table())
            {
                const auto fmt = found->second.as_table_fmt().fmt;
                if(fmt == table_format::oneline || fmt == table_format::multiline_oneline)
                {
                    // foo = {bar = "baz"} or foo = { \n bar = "baz" \n }
                    return err(make_error_info("toml::insert_value: "
                        "failed to insert a value: inline table is immutable",
                        key_loc, "inserting this",
                        found->second.location(), "to this table"));
                }
                // dotted key cannot reopen a table.
                if(kind ==inserting_value_kind::dotted_keys && fmt != table_format::dotted)
                {
                    return err(make_error_info("toml::insert_value: "
                        "reopening a table using dotted keys",
                        key_loc, "dotted key cannot reopen a table",
                        found->second.location(), "this table is already closed"));
                }
                assert(found->second.is_table());
                current_table_ptr = std::addressof(found->second.as_table());
            }
            else if(found->second.is_array_of_tables())
            {
                // aot = [{this = "type", of = "aot"}] # cannot be reopened
                if(found->second.as_array_fmt().fmt != array_format::array_of_tables)
                {
                    return err(make_error_info("toml::insert_value:"
                        "inline array of tables are immutable",
                        key_loc, "inserting this",
                        found->second.location(), "inline array of tables"));
                }
                // appending to [[aot]]

                if(kind == inserting_value_kind::dotted_keys)
                {
                    // [[array.of.tables]]
                    // [array.of]          # reopening supertable is okay
                    // tables.x = "foo"    # appending `x` to the first table
                    return err(make_error_info("toml::insert_value:"
                        "dotted key cannot reopen an array-of-tables",
                        key_loc, "inserting this",
                        found->second.location(), "to this array-of-tables."));
                }

                // insert_value_by_dotkeys::std_table
                // [[array.of.tables]]
                // [array.of.tables.subtable] # appending to the last aot
                //
                // insert_value_by_dotkeys::array_table
                // [[array.of.tables]]
                // [[array.of.tables.subtable]] # appending to the last aot
                auto& current_array_table = found->second.as_array().back();

                assert(current_array_table.is_table());
                current_table_ptr = std::addressof(current_array_table.as_table());
            }
            else
            {
                return err(make_error_info("toml::insert_value: "
                    "failed to insert a value, value already exists",
                    key_loc, "while inserting this",
                    found->second.location(), "non-table value already exists"));
            }
        }
        else // this is the last key. insert a new value.
        {
            switch(kind)
            {
                case inserting_value_kind::dotted_keys:
                {
                    if(current_table.find(key) != current_table.end())
                    {
                        return err(make_error_info("toml::insert_value: "
                            "failed to insert a value, value already exists",
                            key_loc, "inserting this",
                            current_table.at(key).location(), "but value already exists"));
                    }
                    current_table.emplace(key, std::move(val));
                    return ok(std::addressof(current_table.at(key)));
                }
                case inserting_value_kind::std_table:
                {
                    // defining a new table or reopening supertable
                    auto found = current_table.find(key);
                    if(found == current_table.end()) // define a new aot
                    {
                        current_table.emplace(key, std::move(val));
                        return ok(std::addressof(current_table.at(key)));
                    }
                    else // the table is already defined, reopen it
                    {
                        // assigning a [std.table]. it must be an implicit table.
                        auto& target = found->second;
                        if( ! target.is_table() || // could be an array-of-tables
                            target.as_table_fmt().fmt != table_format::implicit)
                        {
                            return err(make_error_info("toml::insert_value: "
                                "failed to insert a table, table already defined",
                                key_loc, "inserting this",
                                target.location(), "this table is explicitly defined"));
                        }

                        // merge table
                        for(const auto& kv : val.as_table())
                        {
                            if(target.contains(kv.first))
                            {
                                // [x.y.z]
                                // w = "foo"
                                // [x]
                                // y = "bar"
                                return err(make_error_info("toml::insert_value: "
                                    "failed to insert a table, table keys conflict to each other",
                                    key_loc, "inserting this table",
                                    kv.second.location(), "having this value",
                                    target.at(kv.first).location(), "already defined here"));
                            }
                            else
                            {
                                target[kv.first] = kv.second;
                            }
                        }
                        // change implicit -> explicit
                        target.as_table_fmt().fmt = table_format::multiline;
                        // change definition region
                        change_region_of_value(target, val);

                        return ok(std::addressof(current_table.at(key)));
                    }
                }
                case inserting_value_kind::array_table:
                {
                    auto found = current_table.find(key);
                    if(found == current_table.end()) // define a new aot
                    {
                        array_format_info fmt;
                        fmt.fmt = array_format::array_of_tables;
                        fmt.indent_type = indent_char::none;

                        current_table.emplace(key, value_type(
                                array_type{ std::move(val) }, std::move(fmt),
                                std::vector<std::string>{}, std::move(key_reg)
                            ));

                        assert( ! current_table.at(key).as_array().empty());
                        return ok(std::addressof(current_table.at(key).as_array().back()));
                    }
                    else // the array is already defined, append to it
                    {
                        if( ! found->second.is_array_of_tables())
                        {
                            return err(make_error_info("toml::insert_value: "
                                "failed to insert an array of tables, value already exists",
                                key_loc, "while inserting this",
                                found->second.location(), "non-table value already exists"));
                        }
                        if(found->second.as_array_fmt().fmt != array_format::array_of_tables)
                        {
                            return err(make_error_info("toml::insert_value: "
                                "failed to insert a table, inline array of tables is immutable",
                                key_loc, "while inserting this",
                                found->second.location(), "this is inline array-of-tables"));
                        }
                        found->second.as_array().push_back(std::move(val));
                        assert( ! current_table.at(key).as_array().empty());
                        return ok(std::addressof(current_table.at(key).as_array().back()));
                    }
                }
                default: {assert(false);}
            }
        }
    }
    return err(make_error_info("toml::insert_key: no keys found",
                std::move(key_loc), "here"));
}